

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O2

void find_cut(void)

{
  pointer piVar1;
  pair<int,_int> *ppVar2;
  ostream *poVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var4;
  mapped_type *pmVar5;
  long lVar6;
  int *piVar7;
  int b;
  uint uVar8;
  long lVar9;
  int j_1;
  pair<int,_int> pVar10;
  int j;
  ulong uVar11;
  bool bVar12;
  allocator_type local_81;
  ulong local_80;
  longlong local_78;
  vector<int,_std::allocator<int>_> local_70;
  long local_58;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_38;
  
  freopen("cut_min.txt","w",_stdout);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0;
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::dis,(long)V * 2,
             (value_type_conflict *)&local_70);
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::ptr,(long)V * 2,
             (value_type_conflict *)&local_70);
  lVar9 = (long)V;
  std::vector<int,_std::allocator<int>_>::vector(&local_70,0,&local_81);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&(anonymous_namespace)::edges_dup,lVar9 * 2,&local_70);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_70);
  pVar10.first = 0;
  pVar10.second = 0;
  local_78 = CONCAT44(local_78._4_4_,V);
  for (lVar9 = 0; lVar9 < V; lVar9 = lVar9 + 1) {
    local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)pVar10;
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &(anonymous_namespace)::top_flow,(pair<int,_int> *)&local_70);
    pVar10 = (pair<int,_int>)((long)pVar10 + 0x100000000);
  }
  for (lVar9 = 0; lVar9 < V; lVar9 = lVar9 + 1) {
    b = (int)lVar9;
    local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _4_4_ = b;
    local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = (int)((ulong)((long)edge.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar9].
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)edge.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar9].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               &(anonymous_namespace)::top_degree,(pair<int,_int> *)&local_70);
    for (uVar11 = 0;
        piVar1 = edge.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar9].
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start,
        uVar11 < (ulong)((long)edge.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar9].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar1 >> 2);
        uVar11 = uVar11 + 1) {
      dinic_addedge(b,piVar1[uVar11] + V,V);
    }
    dinic_addedge(V + b,b,1);
  }
  uVar8 = 100;
  if ((int)(uint)local_78 < 100) {
    uVar8 = (uint)local_78;
  }
  local_38.current._M_current =
       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        )(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          )DAT_0011f230._M_current;
  local_40.current._M_current =
       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        )(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          )(anonymous_namespace)::top_degree._M_current;
  std::
  stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
            (&local_38,&local_40);
  poVar3 = std::operator<<((ostream *)&std::cout,"Minimum cut between characters:");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar11 = 0;
  local_80 = 0;
  if (0 < (int)uVar8) {
    local_80 = (ulong)uVar8;
  }
  lVar9 = 1;
  for (; local_58 = lVar9, uVar11 != local_80; uVar11 = uVar11 + 1) {
    for (; lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (edge.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(anonymous_namespace)::top_degree._M_current[uVar11].second].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         edge.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [(anonymous_namespace)::top_degree._M_current[uVar11].second].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,
                         &(anonymous_namespace)::top_degree._M_current[lVar9].second);
      if (_Var4._M_current ==
          edge.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start
          [(anonymous_namespace)::top_degree._M_current[uVar11].second].
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish) {
        local_78 = dinic_flow((anonymous_namespace)::top_degree._M_current[uVar11].second,
                              V + (anonymous_namespace)::top_degree._M_current[lVar9].second);
        pmVar5 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&name_abi_cxx11_,
                              &(anonymous_namespace)::top_degree._M_current[uVar11].second);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar5);
        poVar3 = std::operator<<(poVar3," -> ");
        pmVar5 = std::
                 map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&name_abi_cxx11_,
                              &(anonymous_namespace)::top_degree._M_current[lVar9].second);
        poVar3 = std::operator<<(poVar3,(string *)pmVar5);
        poVar3 = std::operator<<(poVar3," = ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)local_78);
        std::endl<char,std::char_traits<char>>(poVar3);
        ppVar2 = (anonymous_namespace)::top_flow._M_current;
        lVar6 = DAT_0011f290 - (anonymous_namespace)::edgelist >> 4;
        piVar7 = (int *)((anonymous_namespace)::edgelist + 0xc);
        while (bVar12 = lVar6 != 0, lVar6 = lVar6 + -1, bVar12) {
          if ((piVar7[-3] == V + piVar7[-2]) && (*piVar7 == 1)) {
            ppVar2[piVar7[-2]].first = ppVar2[piVar7[-2]].first + 1;
          }
          *piVar7 = 0;
          piVar7 = piVar7 + 4;
        }
      }
    }
    lVar9 = local_58 + 1;
  }
  local_48.current._M_current =
       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        )(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          )_DAT_0011f248;
  local_50.current._M_current =
       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
        )(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          )(anonymous_namespace)::top_flow._M_current;
  std::
  stable_sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>>
            (&local_48,&local_50);
  poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar3 = std::operator<<(poVar3,"Top involved characters in the flows:");
  std::endl<char,std::char_traits<char>>(poVar3);
  local_80 = local_80 << 3;
  for (lVar9 = 0; local_80 != lVar9; lVar9 = lVar9 + 8) {
    pmVar5 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,
                          (key_type *)
                          ((long)&((anonymous_namespace)::top_flow._M_current)->second + lVar9));
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar5);
    poVar3 = std::operator<<(poVar3," (");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,*(int *)((long)&((anonymous_namespace)::top_flow._M_current)->first +
                                       lVar9));
    poVar3 = std::operator<<(poVar3,")");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return;
}

Assistant:

void find_cut() {
    freopen("cut_min.txt", "w", stdout); // output file
    
    dis.resize(2 * V, 0);
    ptr.resize(2 * V, 0);
    edges_dup.resize(2 * V, vector<int>(0));
    const int top = min(100, V);

    for (int i = 0; i < V; i++)
        top_flow.push_back(make_pair(0, i));

    for (int i = 0; i < V; i++) {
        top_degree.push_back(make_pair(edge[i].size(), i));
        for (int j = 0; j < edge[i].size(); j++) {
            int to = edge[i][j];
            dinic_addedge(i, to + V, V);
        }
        dinic_addedge(i + V, i, 1);
    }
    
    stable_sort(top_degree.rbegin(), top_degree.rend());
    
    cout << "Minimum cut between characters:" << endl;
    for (int i = 0; i < top; i++) {
        for (int j = i + 1; j < top; j++) {
            vector<int>::iterator p = find(edge[top_degree[i].second].begin(), edge[top_degree[i].second].end(), top_degree[j].second);
            
            if (p != edge[top_degree[i].second].end())
                continue;
            
            int flow = dinic_flow(top_degree[i].second, top_degree[j].second + V);
            cout << name[top_degree[i].second] << " -> " << name[top_degree[j].second] << " = " << flow << endl;     

            for (int k = 0; k < edgelist.size(); k++) {
                if ((edgelist[k].a == (edgelist[k].b + V)) && (edgelist[k].flow == 1)) {
                    top_flow[edgelist[k].b].first++;
                }
                edgelist[k].flow = 0;
            }
        }
    }
    
    stable_sort(top_flow.rbegin(), top_flow.rend());

    cout << endl << "Top involved characters in the flows:" << endl;
    for (int i = 0; i < top; i++) {
        cout << name[top_flow[i].second] << " (" << top_flow[i].first << ")" << endl;
    }
}